

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  _func_int **pp_Var1;
  pointer *pppcVar2;
  ulong uVar3;
  iterator __position;
  cmGeneratorTarget *target;
  cmake *pcVar4;
  string *psVar5;
  pointer pbVar6;
  pointer pcVar7;
  bool bVar8;
  TargetType TVar9;
  PolicyStatus PVar10;
  undefined8 *puVar11;
  string *psVar12;
  ostream *poVar13;
  pointer ppcVar14;
  string *c;
  undefined8 uVar15;
  cmExportBuildFileGenerator *pcVar16;
  pointer pbVar17;
  bool bVar18;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar19;
  string expectedTargets;
  cmGeneratorTarget *te;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  ostringstream e;
  undefined1 local_2a0 [32];
  cmGeneratorTarget *local_280;
  pointer local_278;
  ostream *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  cmExportBuildFileGenerator *local_208;
  cmExportBuildFileGenerator *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  string *local_1f0;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [376];
  
  local_2a0._0_8_ = local_2a0 + 0x10;
  local_2a0._8_8_ = 0;
  local_2a0[0x10] = '\0';
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  GetTargets(this,&local_1c8);
  local_1f0 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  bVar18 = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_270 = os;
  if (bVar18) {
    ppcVar14 = (pointer)0;
  }
  else {
    local_1f8 = &(this->super_cmExportFileGenerator).Namespace;
    local_200 = (cmExportBuildFileGenerator *)&(this->super_cmExportFileGenerator).ExportedTargets;
    local_208 = (cmExportBuildFileGenerator *)&this->Exports;
    local_278 = (pointer)0x0;
    pbVar17 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_280 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,pbVar17);
      std::operator+(&local_268,&local_228,local_1f8);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_248,local_280);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar15 = local_268.field_2._M_allocated_capacity;
      }
      uVar3 = (long)(_func_int ***)local_248._M_string_length + local_268._M_string_length;
      if ((ulong)uVar15 < uVar3) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          uVar15 = local_248.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < uVar3) goto LAB_00456331;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_248,0,(char *)0x0,(ulong)local_268._M_dataplus._M_p);
      }
      else {
LAB_00456331:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_268,(ulong)local_248._M_dataplus._M_p);
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      pp_Var1 = (_func_int **)(puVar11 + 2);
      if ((_func_int **)*puVar11 == pp_Var1) {
        local_1a8._16_8_ = *pp_Var1;
        local_1a8._24_8_ = puVar11[3];
      }
      else {
        local_1a8._16_8_ = *pp_Var1;
        local_1a8._0_8_ = (_func_int **)*puVar11;
      }
      local_1a8._8_8_ = puVar11[1];
      *puVar11 = pp_Var1;
      puVar11[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      std::__cxx11::string::_M_append(local_2a0,local_1a8._0_8_);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,
                        (ulong)((long)(_Rb_tree_color *)local_1a8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_228,0,(char *)local_228._M_string_length,0x7903d6);
      pcVar16 = local_200;
      pVar19 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                           *)local_200,&local_280);
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given target \"",0xe);
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(local_280);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar12->_M_dataplus)._M_p,
                             psVar12->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" more than once.",0x11);
        pcVar4 = this->LG->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmMakefile::GetBacktrace(this->LG->Makefile);
        cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_268,(cmListFileBacktrace *)&local_248);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      }
      else {
        __position._M_current =
             (this->Exports).
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Exports).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          pcVar16 = local_208;
          std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
          _M_realloc_insert<cmGeneratorTarget*const&>
                    ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)local_208,
                     __position,&local_280);
        }
        else {
          *__position._M_current = local_280;
          pppcVar2 = &(this->Exports).
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppcVar2 = *pppcVar2 + 1;
        }
        TVar9 = GetExportTargetType(pcVar16,local_280);
        local_278 = (pointer)CONCAT71((int7)((ulong)local_278 >> 8),
                                      (byte)local_278 | TVar9 == INTERFACE_LIBRARY);
      }
      ppcVar14 = local_278;
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
      pbVar17 = pbVar17 + 1;
      bVar18 = pbVar17 == local_1f0;
    } while (!bVar18);
  }
  poVar13 = local_270;
  if (bVar18) {
    if (((ulong)ppcVar14 & 1) != 0) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                (this,local_270,"3.0.0");
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,poVar13,local_2a0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  pcVar16 = (cmExportBuildFileGenerator *)local_2a0._0_8_;
  if ((cmExportBuildFileGenerator *)local_2a0._0_8_ !=
      (cmExportBuildFileGenerator *)(local_2a0 + 0x10)) {
    operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
  }
  if (bVar18) {
    ppcVar14 = (this->Exports).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_278 = (this->Exports).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    bVar18 = ppcVar14 == local_278;
    if (!bVar18) {
      do {
        target = *ppcVar14;
        GetExportTargetType(pcVar16,target);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])(this,local_270,target)
        ;
        cmTarget::AppendBuildInterfaceIncludes(target->Target);
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_1a8._16_8_ = (_Base_ptr)0x0;
        local_1a8._24_8_ = local_1a8 + 8;
        local_1a8._40_8_ = 0;
        local_2a0._0_8_ = local_2a0 + 0x10;
        local_1a8._32_8_ = local_1a8._24_8_;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"INTERFACE_SOURCES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_PRECOMPILE_HEADERS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_LINK_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_LINK_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_LINK_DEPENDS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,BuildInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a0,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,(string *)local_2a0,target,
                   (ImportPropertyMap *)local_1a8);
        if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        local_2a0._0_8_ = local_2a0 + 0x10;
        local_2a0._8_8_ = 0;
        local_2a0[0x10] = '\0';
        bVar8 = cmExportFileGenerator::PopulateExportProperties
                          (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)local_1a8,
                           (string *)local_2a0);
        if (bVar8) {
          PVar10 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022);
          if ((PVar10 != WARN) &&
             (PVar10 = cmPolicies::PolicyMap::Get(&target->PolicyMap,CMP0022), PVar10 != OLD)) {
            cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                      (&this->super_cmExportFileGenerator,target,BuildInterface,
                       (ImportPropertyMap *)local_1a8);
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)local_1a8);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,target,local_270);
          cmExportFileGenerator::GenerateTargetFileSets
                    (&this->super_cmExportFileGenerator,target,local_270,(cmTargetExport *)0x0);
        }
        else {
          pcVar4 = this->LG->GlobalGenerator->CMakeInstance;
          cmMakefile::GetBacktrace(this->LG->Makefile);
          cmake::IssueMessage(pcVar4,FATAL_ERROR,(string *)local_2a0,
                              (cmListFileBacktrace *)&local_228);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length);
          }
        }
        if ((cmExportBuildFileGenerator *)local_2a0._0_8_ !=
            (cmExportBuildFileGenerator *)(local_2a0 + 0x10)) {
          operator_delete((void *)local_2a0._0_8_,CONCAT71(local_2a0._17_7_,local_2a0[0x10]) + 1);
        }
        pcVar16 = (cmExportBuildFileGenerator *)local_1a8;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)pcVar16);
        if (!bVar8) {
          if (!bVar18) goto LAB_00456c09;
          break;
        }
        ppcVar14 = ppcVar14 + 1;
        bVar18 = ppcVar14 == local_278;
      } while (!bVar18);
    }
    poVar13 = local_270;
    cmExportFileGenerator::GenerateCxxModuleInformation
              (&this->super_cmExportFileGenerator,local_270);
    psVar5 = (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar12 = (this->super_cmExportFileGenerator).Configurations.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar5;
        psVar12 = psVar12 + 1) {
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,poVar13,psVar12);
    }
    pbVar17 = (this->super_cmExportFileGenerator).Configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar17 != pbVar6) {
      do {
        pcVar7 = (pbVar17->_M_dataplus)._M_p;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar7,pcVar7 + pbVar17->_M_string_length);
        GenerateImportCxxModuleConfigTargetInclusion(this,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        pbVar17 = pbVar17 + 1;
      } while (pbVar17 != pbVar6);
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,poVar13);
    bVar18 = true;
  }
  else {
LAB_00456c09:
    bVar18 = false;
  }
  return bVar18;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<std::string> targets;
    bool generatedInterfaceRequired = false;
    this->GetTargets(targets);
    for (std::string const& tei : targets) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(tei);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.push_back(te);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      generatedInterfaceRequired |=
        this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY;
    }

    if (generatedInterfaceRequired) {
      this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Create all the imported targets.
  for (cmGeneratorTarget* gte : this->Exports) {
    this->GenerateImportTargetCode(os, gte, this->GetExportTargetType(gte));

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DEPENDS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gte, properties, errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);

    this->GenerateTargetFileSets(gte, os);
  }

  this->GenerateCxxModuleInformation(os);

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportConfig(os, c);
  }

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportCxxModuleConfigTargetInclusion(c);
  }

  this->GenerateMissingTargetsCheckCode(os);

  return true;
}